

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_digest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  string err;
  anon_class_16_2_6a24d160 process_motif;
  args_t args;
  char complement_chars [255];
  StringBuffer SStack_188;
  anon_class_16_2_6a24d160 local_168;
  args_t local_158;
  char local_138 [65];
  undefined1 local_f7;
  undefined1 local_f5;
  undefined1 local_f1;
  undefined1 local_e4;
  
  argparse::args_t::args_t(&local_158,argc,argv);
  initAlphabets(false,(char *)0x0,true);
  memset(allowed_chars,0xff,0x400);
  allowed_chars[0x41] = 0;
  allowed_chars[0x43] = 1;
  allowed_chars[0x47] = 2;
  allowed_chars[0x54] = 3;
  memset((char (*) [255])local_138,0,0xff);
  local_f7 = 0x54;
  local_e4 = 0x41;
  local_f5 = 0x47;
  local_f1 = 0x43;
  local_168.args = &local_158;
  local_168.complement_chars = (char (*) [255])local_138;
  StringBuffer::StringBuffer(&SStack_188);
  sVar5 = strlen(local_158.motif_list);
  if (0 < (long)sVar5) {
    bVar3 = false;
    uVar6 = 0;
    uVar7 = 1;
    do {
      iVar4 = toupper((int)local_158.motif_list[uVar6]);
      iVar1 = allowed_chars[(char)iVar4];
      if (iVar1 < 0) {
        if (bVar3) {
          main::anon_class_16_2_6a24d160::operator()(&local_168,&SStack_188);
        }
        bVar3 = false;
      }
      else {
        bVar3 = true;
        StringBuffer::appendChar(&SStack_188,(char)iVar4);
      }
      bVar2 = (long)uVar7 < (long)sVar5;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
    if (-1 < iVar1) {
      main::anon_class_16_2_6a24d160::operator()(&local_168,&SStack_188);
    }
  }
  StringBuffer::~StringBuffer(&SStack_188);
  argparse::args_t::~args_t(&local_158);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    initAlphabets(false, NULL, true);
    
    
    for (int i = 0; i < 256; i++) {
        allowed_chars[i] = -1;
    }
    
    allowed_chars['A'] = 0;
    allowed_chars['C'] = 1;
    allowed_chars['G'] = 2;
    allowed_chars['T'] = 3;
    
    char complement_chars[255] = {0};
    complement_chars['A'] = 'T';
    complement_chars['T'] = 'A';
    complement_chars['C'] = 'G';
    complement_chars['G'] = 'C';


    auto process_motif = [&] (StringBuffer& pattern) -> void {
        int L = pattern.length();
        if (L >= 4 && L <= 16) {
            cout << pattern.getString () << endl;
            if (!patterns[L]) {
                patterns[L] = new Vector;
            }
            patterns[L]->appendValue(patternToCode (pattern));
            
            if (args.rc == complement) {
                StringBuffer rc;
                for (int i = L-1; i>=0; i--) {
                    rc.appendChar (complement_chars[pattern.getChar (i)]);
                }
                patterns[L]->appendValue(patternToCode (rc));
            }
            
            pattern.resetString ();
        } else {
            throw (std::string ("Motif '") + std::string (pattern.getString()) + "' is not 4-16 nucleotides in length");
        }
    };
    
    try {
        // parse the patterns
        StringBuffer pattern;
        char automatonState = 0;
        long firstSequenceLength = strlen (args.motif_list);
 
        for (unsigned i = 0; i < firstSequenceLength; i++) {
            char current_char = toupper (args.motif_list[i]);
            if (allowed_chars [current_char] >= 0) {
                automatonState = 1;
                pattern.appendChar (current_char);
            } else {
                if (automatonState == 1) {
                    process_motif (pattern);
                }
                automatonState = 0;
            }
        }
        
        if (automatonState == 1) {
            process_motif (pattern);
        }

        return 1;
        automatonState = 0;
        while (long state = readFASTA(args.input, automatonState, names, sequences, nameLengths,
                                      seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            firstSequenceLength = 0L;
        }

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}